

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabin_karp.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  long *plVar2;
  string local_b0;
  string local_90;
  size_type *local_70;
  string source;
  string target;
  
  local_70 = &source._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"sdsafsakobeasdsafsaf","");
  source.field_2._8_8_ = &target._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&source.field_2 + 8),"kobe","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_70,source._M_dataplus._M_p + (long)local_70);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,source.field_2._8_8_,target._M_dataplus._M_p + source.field_2._8_8_
            );
  iVar1 = strStr(&local_b0,&local_90);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((size_type *)source.field_2._8_8_ != &target._M_string_length) {
    operator_delete((void *)source.field_2._8_8_);
  }
  if (local_70 != &source._M_string_length) {
    operator_delete(local_70);
  }
  return 0;
}

Assistant:

int main()
{
    std::string source = "sdsafsakobeasdsafsaf";
    std::string target = "kobe";
    std::cout<<strStr(source,target)<<std::endl;
}